

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O0

void __thiscall Rml::ElementHandle::ProcessDefaultAction(ElementHandle *this,Event *event)

{
  pointer *this_00;
  Vector2f VVar1;
  Vector2<float> rhs;
  bool bVar2;
  ElementHandle *pEVar3;
  ElementDocument *pEVar4;
  ulong uVar5;
  Element *pEVar6;
  undefined8 uVar7;
  type pVVar8;
  NumericValue *local_6b8;
  undefined1 local_668 [8];
  Dictionary parameters;
  Property local_600;
  Property local_5b0;
  Property local_560;
  Vector2<float> local_510;
  Vector2<float> local_508;
  Vector2<float> local_500;
  Vector2f new_position_bottom_right_1;
  Vector2<float> local_4e8;
  Vector2f local_4e0;
  Vector2f local_4d8;
  Vector2f new_size;
  Property local_480;
  Property local_430;
  Property local_3e0;
  Vector2<float> local_390;
  Vector2<float> local_388;
  Vector2<float> local_380;
  Vector2f new_position_bottom_right;
  Vector2<float> local_370;
  Vector2<float> local_368;
  Vector2f new_position_top_left;
  Vector2f local_348;
  Vector2<float> local_340;
  Vector2f local_338;
  Vector2f delta;
  Vector2f local_318;
  Vector2f local_310;
  Vector2f local_304;
  SizeData local_2fc;
  undefined1 local_2e8 [8];
  ElementHandleTargetData size_target_data;
  Vector2f local_29c;
  undefined4 local_294;
  undefined1 local_290 [8];
  ElementHandleTargetData move_target_data;
  Vector2f local_248;
  Vector2f local_240;
  Context *local_238;
  Context *context;
  undefined1 local_210 [8];
  HandleEdgeMarginParser parser;
  NumericValue NStack_18c;
  NumericValue local_184;
  NumericValue NStack_17c;
  undefined1 auStack_174 [43];
  allocator<char> local_149;
  String local_148;
  undefined1 local_128 [8];
  String edge_margin_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_d9;
  String local_d8;
  undefined1 local_b8 [8];
  String size_target_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  String local_58;
  undefined1 local_38 [8];
  String move_target_name;
  Event *event_local;
  ElementHandle *this_local;
  
  move_target_name.field_2._8_8_ = event;
  Element::ProcessDefaultAction(&this->super_Element,event);
  pEVar3 = (ElementHandle *)Event::GetTargetElement((Event *)move_target_name.field_2._8_8_);
  if (pEVar3 == this) {
    if (((this->initialised & 1U) == 0) &&
       (pEVar4 = Element::GetOwnerDocument(&this->super_Element), pEVar4 != (ElementDocument *)0x0))
    {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"move_target",&local_59);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"",
                 (allocator<char> *)(size_target_name.field_2._M_local_buf + 0xf));
      Element::GetAttribute<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &this->super_Element,&local_58,&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)(size_target_name.field_2._M_local_buf + 0xf));
      ::std::__cxx11::string::~string((string *)&local_58);
      ::std::allocator<char>::~allocator(&local_59);
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pEVar6 = Element::GetElementById(&this->super_Element,(String *)local_38);
        this->move_target = pEVar6;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"size_target",&local_d9);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"",
                 (allocator<char> *)(edge_margin_str.field_2._M_local_buf + 0xf));
      Element::GetAttribute<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 &this->super_Element,&local_d8,&local_100);
      ::std::__cxx11::string::~string((string *)&local_100);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)(edge_margin_str.field_2._M_local_buf + 0xf));
      ::std::__cxx11::string::~string((string *)&local_d8);
      ::std::allocator<char>::~allocator(&local_d9);
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pEVar6 = Element::GetElementById(&this->super_Element,(String *)local_b8);
        this->size_target = pEVar6;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"edge_margin",&local_149);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)(auStack_174 + 4),"0px",(allocator<char> *)(auStack_174 + 3));
      Element::GetAttribute<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                 &this->super_Element,&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (auStack_174 + 4));
      ::std::__cxx11::string::~string((string *)(auStack_174 + 4));
      ::std::allocator<char>::~allocator((allocator<char> *)(auStack_174 + 3));
      ::std::__cxx11::string::~string((string *)&local_148);
      ::std::allocator<char>::~allocator(&local_149);
      memset(&parser.id_constraint,0,0x20);
      local_6b8 = (NumericValue *)&parser.id_constraint;
      do {
        NumericValue::NumericValue(local_6b8);
        local_6b8 = local_6b8 + 1;
      } while (local_6b8 != (NumericValue *)auStack_174);
      (this->edge_margin)._M_elems[2] = local_184;
      (this->edge_margin)._M_elems[3] = NStack_17c;
      (this->edge_margin)._M_elems[0] = stack0xfffffffffffffe6c;
      (this->edge_margin)._M_elems[1] = NStack_18c;
      bVar2 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_128,"none");
      if (bVar2) {
        HandleEdgeMarginParser::HandleEdgeMarginParser((HandleEdgeMarginParser *)local_210);
        bVar2 = HandleEdgeMarginParser::Parse
                          ((HandleEdgeMarginParser *)local_210,(String *)local_128,
                           &this->edge_margin);
        if (!bVar2) {
          Element::GetAddress_abi_cxx11_((String *)&context,&this->super_Element,false,true);
          uVar7 = ::std::__cxx11::string::c_str();
          Log::Message(LT_WARNING,"Failed to parse \'edge_margin\' attribute for element \'%s\'.",
                       uVar7);
          ::std::__cxx11::string::~string((string *)&context);
        }
        HandleEdgeMarginParser::~HandleEdgeMarginParser((HandleEdgeMarginParser *)local_210);
      }
      this->initialised = true;
      ::std::__cxx11::string::~string((string *)local_128);
      ::std::__cxx11::string::~string((string *)local_b8);
      ::std::__cxx11::string::~string((string *)local_38);
    }
    bVar2 = Event::operator==((Event *)move_target_name.field_2._8_8_,Dragstart);
    if (bVar2) {
      local_238 = Element::GetContext(&this->super_Element);
      local_240 = Event::GetUnprojectedMouseScreenPos((Event *)move_target_name.field_2._8_8_);
      this->drag_start = local_240;
      Vector2<float>::Vector2(&local_248,-3.4028235e+38,-3.4028235e+38);
      this->drag_delta_min = local_248;
      Vector2<float>::Vector2
                ((Vector2<float> *)(move_target_data.resolved_edge_margin._M_elems + 3),
                 3.4028235e+38,3.4028235e+38);
      (this->drag_delta_max).x = move_target_data.resolved_edge_margin._M_elems[3];
      (this->drag_delta_max).y = (float)move_target_data._60_4_;
      if ((this->move_target != (Element *)0x0) && (local_238 != (Context *)0x0)) {
        ElementHandleTargetData::ElementHandleTargetData
                  ((ElementHandleTargetData *)local_290,this->move_target,local_238,
                   &this->edge_margin);
        ElementHandleTargetData::GetMoveData
                  ((MoveData *)&size_target_data.field_0x3c,(ElementHandleTargetData *)local_290,
                   &this->drag_delta_min,&this->drag_delta_max);
        (this->move_data).original_position_top_left = stack0xfffffffffffffd5c;
        (this->move_data).original_position_bottom_right = local_29c;
        (this->move_data).top_left.x = (bool)(undefined1)local_294;
        (this->move_data).top_left.y = (bool)local_294._1_1_;
        (this->move_data).bottom_right.x = (bool)local_294._2_1_;
        (this->move_data).bottom_right.y = (bool)local_294._3_1_;
      }
      if ((this->size_target != (Element *)0x0) && (local_238 != (Context *)0x0)) {
        ElementHandleTargetData::ElementHandleTargetData
                  ((ElementHandleTargetData *)local_2e8,this->size_target,local_238,
                   &this->edge_margin);
        ElementHandleTargetData::GetSizeData
                  (&local_2fc,(ElementHandleTargetData *)local_2e8,&this->drag_delta_min,
                   &this->drag_delta_max);
        (this->size_data).original_size = local_2fc.original_size;
        (this->size_data).original_position_bottom_right = local_2fc.original_position_bottom_right;
        (this->size_data).width_height = local_2fc.width_height;
        (this->size_data).bottom_right = local_2fc.bottom_right;
      }
      local_310 = this->drag_delta_min;
      Vector2<float>::Vector2(&local_318,0.0,0.0);
      local_304 = Math::Min<Rml::Vector2<float>>(local_310,local_318);
      this->drag_delta_min = local_304;
      VVar1 = this->drag_delta_max;
      Vector2<float>::Vector2(&delta,0.0,0.0);
      VVar1 = Math::Max<Rml::Vector2<float>>(VVar1,delta);
      this->drag_delta_max = VVar1;
    }
    else {
      bVar2 = Event::operator==((Event *)move_target_name.field_2._8_8_,Drag);
      if (bVar2) {
        local_348 = Event::GetUnprojectedMouseScreenPos((Event *)move_target_name.field_2._8_8_);
        rhs.x = (this->drag_start).x;
        rhs.y = (this->drag_start).y;
        local_340 = Vector2<float>::operator-(&local_348,rhs);
        new_position_top_left = this->drag_delta_max;
        local_338 = Math::Clamp<Rml::Vector2<float>>
                              (local_340,this->drag_delta_min,new_position_top_left);
        if (this->move_target != (Element *)0x0) {
          new_position_bottom_right = local_338;
          local_370 = Vector2<float>::operator+
                                (&(this->move_data).original_position_top_left,local_338);
          local_368 = Vector2<float>::Round(&local_370);
          local_390.x = local_338.x;
          local_390.y = local_338.y;
          local_388 = Vector2<float>::operator-
                                (&(this->move_data).original_position_bottom_right,local_338);
          local_380 = Vector2<float>::Round(&local_388);
          if (((this->move_data).top_left.x & 1U) != 0) {
            pEVar6 = this->move_target;
            Property::Property<float>(&local_3e0,local_368.x,PX,-1);
            Element::SetProperty(pEVar6,Left,&local_3e0);
            Property::~Property(&local_3e0);
          }
          if (((this->move_data).top_left.y & 1U) != 0) {
            pEVar6 = this->move_target;
            Property::Property<float>(&local_430,local_368.y,PX,-1);
            Element::SetProperty(pEVar6,Top,&local_430);
            Property::~Property(&local_430);
          }
          if (((this->move_data).bottom_right.x & 1U) != 0) {
            pEVar6 = this->move_target;
            Property::Property<float>(&local_480,local_380.x,PX,-1);
            Element::SetProperty(pEVar6,Right,&local_480);
            Property::~Property(&local_480);
          }
          if (((this->move_data).bottom_right.y & 1U) != 0) {
            pEVar6 = this->move_target;
            Property::Property<float>((Property *)&new_size,local_380.y,PX,-1);
            Element::SetProperty(pEVar6,Bottom,(Property *)&new_size);
            Property::~Property((Property *)&new_size);
          }
        }
        if (this->size_target != (Element *)0x0) {
          local_4e8 = Vector2<float>::operator+(&(this->size_data).original_size,local_338);
          local_4e0 = Vector2<float>::Round(&local_4e8);
          Vector2<float>::Vector2(&new_position_bottom_right_1,0.0);
          local_4d8 = Math::Max<Rml::Vector2<float>>(local_4e0,new_position_bottom_right_1);
          local_510.x = local_338.x;
          local_510.y = local_338.y;
          local_508 = Vector2<float>::operator-
                                (&(this->size_data).original_position_bottom_right,local_338);
          local_500 = Vector2<float>::Round(&local_508);
          if (((this->size_data).width_height.x & 1U) != 0) {
            pEVar6 = this->size_target;
            Property::Property<float>(&local_560,local_4d8.x,PX,-1);
            Element::SetProperty(pEVar6,Width,&local_560);
            Property::~Property(&local_560);
          }
          if (((this->size_data).width_height.y & 1U) != 0) {
            pEVar6 = this->size_target;
            Property::Property<float>(&local_5b0,local_4d8.y,PX,-1);
            Element::SetProperty(pEVar6,Height,&local_5b0);
            Property::~Property(&local_5b0);
          }
          if (((this->size_data).bottom_right.x & 1U) != 0) {
            pEVar6 = this->size_target;
            Property::Property<float>(&local_600,local_500.x,PX,-1);
            Element::SetProperty(pEVar6,Right,&local_600);
            Property::~Property(&local_600);
          }
          if (((this->size_data).bottom_right.y & 1U) != 0) {
            pEVar6 = this->size_target;
            this_00 = &parameters.m_container.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            Property::Property<float>((Property *)this_00,local_500.y,PX,-1);
            Element::SetProperty(pEVar6,Bottom,(Property *)this_00);
            Property::~Property((Property *)
                                &parameters.m_container.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
        }
        itlib::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
        ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                    *)local_668);
        pVVar8 = itlib::
                 flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                 ::operator[]<char_const(&)[9]>
                           ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                             *)local_668,(char (*) [9])"handle_x");
        Variant::operator=(pVVar8,&local_338.x);
        pVVar8 = itlib::
                 flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                 ::operator[]<char_const(&)[9]>
                           ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                             *)local_668,(char (*) [9])"handle_y");
        Variant::operator=(pVVar8,&local_338.y);
        Element::DispatchEvent(&this->super_Element,Handledrag,(Dictionary *)local_668);
        itlib::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
        ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                     *)local_668);
      }
    }
  }
  return;
}

Assistant:

void ElementHandle::ProcessDefaultAction(Event& event)
{
	Element::ProcessDefaultAction(event);

	if (event.GetTargetElement() == this)
	{
		if (!initialised && GetOwnerDocument())
		{
			const String move_target_name = GetAttribute<String>("move_target", "");
			if (!move_target_name.empty())
				move_target = GetElementById(move_target_name);

			const String size_target_name = GetAttribute<String>("size_target", "");
			if (!size_target_name.empty())
				size_target = GetElementById(size_target_name);

			const String edge_margin_str = GetAttribute<String>("edge_margin", "0px");
			edge_margin = {};
			if (edge_margin_str != "none")
			{
				HandleEdgeMarginParser parser;
				if (!parser.Parse(edge_margin_str, edge_margin))
					Log::Message(Log::LT_WARNING, "Failed to parse 'edge_margin' attribute for element '%s'.", GetAddress().c_str());
			}

			initialised = true;
		}

		if (event == EventId::Dragstart)
		{
			using namespace Style;
			Context* context = GetContext();
			drag_start = event.GetUnprojectedMouseScreenPos();
			drag_delta_min = {-FLT_MAX, -FLT_MAX};
			drag_delta_max = {FLT_MAX, FLT_MAX};

			if (move_target && context)
			{
				ElementHandleTargetData move_target_data(move_target, context, edge_margin);
				move_data = move_target_data.GetMoveData(drag_delta_min, drag_delta_max);
			}

			if (size_target && context)
			{
				ElementHandleTargetData size_target_data(size_target, context, edge_margin);
				size_data = size_target_data.GetSizeData(drag_delta_min, drag_delta_max);
			}

			drag_delta_min = Math::Min(drag_delta_min, Vector2f{0, 0});
			drag_delta_max = Math::Max(drag_delta_max, Vector2f{0, 0});
		}
		else if (event == EventId::Drag)
		{
			const Vector2f delta = Math::Clamp(event.GetUnprojectedMouseScreenPos() - drag_start, drag_delta_min, drag_delta_max);

			if (move_target)
			{
				const Vector2f new_position_top_left = (move_data.original_position_top_left + delta).Round();
				const Vector2f new_position_bottom_right = (move_data.original_position_bottom_right - delta).Round();

				if (move_data.top_left.x)
					move_target->SetProperty(PropertyId::Left, Property(new_position_top_left.x, Unit::PX));
				if (move_data.top_left.y)
					move_target->SetProperty(PropertyId::Top, Property(new_position_top_left.y, Unit::PX));
				if (move_data.bottom_right.x)
					move_target->SetProperty(PropertyId::Right, Property(new_position_bottom_right.x, Unit::PX));
				if (move_data.bottom_right.y)
					move_target->SetProperty(PropertyId::Bottom, Property(new_position_bottom_right.y, Unit::PX));
			}

			if (size_target)
			{
				const Vector2f new_size = Math::Max((size_data.original_size + delta).Round(), Vector2f(0.f));
				const Vector2f new_position_bottom_right = (size_data.original_position_bottom_right - delta).Round();

				if (size_data.width_height.x)
					size_target->SetProperty(PropertyId::Width, Property(new_size.x, Unit::PX));
				if (size_data.width_height.y)
					size_target->SetProperty(PropertyId::Height, Property(new_size.y, Unit::PX));
				if (size_data.bottom_right.x)
					size_target->SetProperty(PropertyId::Right, Property(new_position_bottom_right.x, Unit::PX));
				if (size_data.bottom_right.y)
					size_target->SetProperty(PropertyId::Bottom, Property(new_position_bottom_right.y, Unit::PX));
			}

			Dictionary parameters;
			parameters["handle_x"] = delta.x;
			parameters["handle_y"] = delta.y;
			DispatchEvent(EventId::Handledrag, parameters);
		}
	}
}